

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O2

int parsenetrc(char *host,char **loginp,char **passwordp,_Bool *login_changed,
              _Bool *password_changed,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  char *__s1;
  char *__s1_00;
  char *first;
  char cVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  int local_107c;
  char *tok_buf;
  char netrcbuffer [4096];
  
  __s1 = *loginp;
  if (__s1 == (char *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = *__s1 != '\0';
  }
  __s1_00 = *passwordp;
  __stream = fopen64(netrcfile,"r");
  if (__stream == (FILE *)0x0) {
    iVar8 = 1;
  }
  else {
    iVar8 = 1;
    bVar3 = false;
    bVar4 = false;
    cVar7 = '\0';
    bVar1 = false;
    bVar2 = false;
    local_107c = 0;
    bVar10 = false;
    while (!bVar10) {
      do {
        pcVar6 = fgets(netrcbuffer,0x1000,__stream);
        if (pcVar6 == (char *)0x0) goto LAB_0012114b;
        pcVar6 = strtok_r(netrcbuffer," \t\n",&tok_buf);
      } while ((pcVar6 != (char *)0x0) && (*pcVar6 == '#'));
      while ((bVar10 = pcVar6 != (char *)0x0, bVar10 &&
             (((__s1 == (char *)0x0 || (__s1_00 == (char *)0x0 || *__s1 == '\0')) ||
              (*__s1_00 == '\0'))))) {
        if (cVar7 == '\x02') {
          if (bVar1) {
            if (bVar9) {
              local_107c = Curl_strcasecompare(__s1,pcVar6);
            }
            else if ((__s1 == (char *)0x0) || (iVar5 = strcmp(__s1,pcVar6), iVar5 != 0)) {
              if (bVar3) {
                (*Curl_cfree)(__s1);
                bVar3 = false;
              }
              __s1 = (*Curl_cstrdup)(pcVar6);
              bVar1 = false;
              if (__s1 != (char *)0x0) {
                bVar3 = true;
                goto LAB_00121063;
              }
              __s1 = (char *)0x0;
LAB_00121202:
              iVar8 = -1;
              goto LAB_00121150;
            }
            bVar1 = false;
          }
          else {
            if (bVar2) {
              bVar1 = false;
              if ((bool)(bVar9 & local_107c == 0)) {
                cVar7 = '\x02';
                bVar2 = false;
                local_107c = 0;
                goto LAB_00121067;
              }
              if ((__s1_00 == (char *)0x0) || (iVar5 = strcmp(__s1_00,pcVar6), iVar5 != 0)) {
                if (bVar4) {
                  (*Curl_cfree)(__s1_00);
                  bVar4 = false;
                }
                __s1_00 = (*Curl_cstrdup)(pcVar6);
                if (__s1_00 == (char *)0x0) {
                  __s1_00 = (char *)0x0;
                  goto LAB_00121202;
                }
                bVar4 = true;
              }
              cVar7 = '\x02';
LAB_00121101:
              bVar1 = false;
              bVar2 = false;
              goto LAB_00121067;
            }
            iVar5 = Curl_strcasecompare("login",pcVar6);
            if (iVar5 == 0) {
              iVar5 = Curl_strcasecompare("password",pcVar6);
              bVar1 = false;
              if (iVar5 == 0) {
                iVar5 = Curl_strcasecompare("machine",pcVar6);
                if (iVar5 != 0) {
                  local_107c = 0;
                }
                cVar7 = (iVar5 == 0) + '\x01';
                goto LAB_00121101;
              }
              bVar2 = true;
            }
            else {
              bVar1 = true;
              bVar2 = false;
            }
          }
LAB_00121063:
          cVar7 = '\x02';
        }
        else {
          first = host;
          if (cVar7 != '\x01') {
            iVar5 = Curl_strcasecompare("machine",pcVar6);
            if (iVar5 != 0) {
              cVar7 = '\x01';
              goto LAB_00121067;
            }
            first = "default";
          }
          iVar5 = Curl_strcasecompare(first,pcVar6);
          if (iVar5 != 0) {
            iVar8 = 0;
          }
          cVar7 = (iVar5 != 0) * '\x02';
        }
LAB_00121067:
        pcVar6 = strtok_r((char *)0x0," \t\n",&tok_buf);
      }
    }
LAB_0012114b:
    if (iVar8 == 0) {
      iVar8 = 0;
      *login_changed = false;
      *password_changed = false;
      if (bVar3) {
        if (*loginp != (char *)0x0) {
          (*Curl_cfree)(*loginp);
        }
        *loginp = __s1;
        *login_changed = true;
      }
      if (bVar4) {
        if (*passwordp != (char *)0x0) {
          (*Curl_cfree)(*passwordp);
        }
        *passwordp = __s1_00;
        *password_changed = true;
      }
    }
    else {
LAB_00121150:
      if (bVar3) {
        (*Curl_cfree)(__s1);
      }
      if (bVar4) {
        (*Curl_cfree)(__s1_00);
      }
    }
    fclose(__stream);
  }
  return iVar8;
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      bool *login_changed,
                      bool *password_changed,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = FALSE;  /* With specific_login, found *our* login
                                   name */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok = strtok_r(netrcbuffer, " \t\n", &tok_buf);
      if(tok && *tok == '#')
        /* treat an initial hash as a comment line */
        continue;
      while(tok) {

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = strcasecompare(login, tok);
            }
            else if(!login || strcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
                && (!password || strcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    if(!retcode) {
      /* success */
      *login_changed = FALSE;
      *password_changed = FALSE;
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
        *login_changed = TRUE;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
        *password_changed = TRUE;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}